

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dpmr.cpp
# Opt level: O3

void __thiscall DSDcc::DSDdPMR::processColourCode(DSDdPMR *this,int symbolIndex,int dibit)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  double in_XMM0_Qa;
  
  this->m_colourBuffer[symbolIndex] = 1 < dibit;
  if (symbolIndex == 0xb) {
    this->m_colourCode = 0;
    puVar1 = this->m_colourBuffer + 0xb;
    iVar2 = 0;
    iVar3 = 0;
    do {
      if (*puVar1 == '\x01') {
        iVar3 = iVar3 + (1 << ((byte)iVar2 & 0x1f));
        this->m_colourCode = iVar3;
      }
      iVar2 = iVar2 + 1;
      puVar1 = puVar1 + -1;
    } while (iVar2 != 0xc);
    DSDLogger::log(&this->m_dsdDecoder->m_dsdLogger,in_XMM0_Qa);
    return;
  }
  return;
}

Assistant:

void DSDdPMR::processColourCode(int symbolIndex, int dibit)
{
    m_colourBuffer[symbolIndex] = (dibit > 1 ? 1 : 0); // 01->0, 11->1 with 00 and 01 on the same positive side and 10 and 11 on the same negative side

    if (symbolIndex == 11) // last symbol
    {
        m_colourCode = 0;

        for (int i = 11, n = 0; i >= 0; i--, n++) // colour code is stored MSB first
        {
            if (m_colourBuffer[i] == 1)
            {
                m_colourCode += (1<<n); // bit is 1
            }
        }

        m_dsdDecoder->getLogger().log("DSDdPMR::processColourCode: %d\n", m_colourCode); // DEBUG
    }
}